

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

bool __thiscall slang::ast::IntegralType::isDeclaredReg(IntegralType *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  bool bVar3;
  
  SVar1 = (this->super_Type).super_Symbol.kind;
  while (SVar1 == PackedArrayType) {
    pTVar2 = *(Type **)&this[1].super_Type.super_Symbol;
    this = (IntegralType *)pTVar2->canonical;
    if (this == (IntegralType *)0x0) {
      Type::resolveCanonical(pTVar2);
      this = (IntegralType *)pTVar2->canonical;
    }
    SVar1 = (this->super_Type).super_Symbol.kind;
  }
  pTVar2 = (this->super_Type).canonical;
  if (pTVar2 == (Type *)0x0) {
    Type::resolveCanonical(&this->super_Type);
    pTVar2 = (this->super_Type).canonical;
  }
  if ((pTVar2->super_Symbol).kind == ScalarType) {
    bVar3 = this[1].super_Type.super_Symbol.kind == Definition;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool IntegralType::isDeclaredReg() const {
    const Type* type = this;
    while (type->kind == SymbolKind::PackedArrayType)
        type = &type->as<PackedArrayType>().elementType.getCanonicalType();

    if (type->isScalar())
        return type->as<ScalarType>().scalarKind == ScalarType::Reg;

    return false;
}